

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.h
# Opt level: O2

void __thiscall
Js::TypedArray<float,_false,_true>::MarshalToScriptContext
          (TypedArray<float,_false,_true> *this,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((((((this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.super_DynamicObject
          .super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
      scriptContext.ptr == scriptContext) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Library/TypedArray.h"
                                ,0x105,"(this->GetScriptContext() != scriptContext)",
                                "this->GetScriptContext() != scriptContext");
    if (!bVar2) goto LAB_00387a18;
    *puVar3 = 0;
  }
  if ((_func_int **)
      (this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.super_DynamicObject.
      super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject !=
      (_func_int **)VirtualTableInfo<Js::TypedArray<float,_false,_true>_>::Address) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Library/TypedArray.h"
                                ,0x105,"(VirtualTableInfo<TypedArray>::HasVirtualTable(this))",
                                "Derived class need to define marshal to script context");
    if (!bVar2) {
LAB_00387a18:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  (this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.super_DynamicObject.
  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject =
       (IRecyclerVisitedObject)
       VirtualTableInfo<Js::CrossSiteObject<Js::TypedArray<float,_false,_true>_>_>::Address;
  return;
}

Assistant:

TypedArray(DynamicType *type): TypedArrayBase(nullptr, 0, 0, sizeof(TypeName), type) { buffer = nullptr; }